

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io.c
# Opt level: O1

void bit_copy(byte_t source,byte_t *destination,int read_pos,int write_pos,int size)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  
  if (0 < size) {
    uVar1 = (ulong)(uint)write_pos;
    do {
      iVar3 = (int)uVar1 + (int)(uVar1 >> 0x1f) * 8;
      bVar2 = (byte)iVar3;
      *destination = ((source >> (read_pos & 0x1fU) & 1) != 0) << (bVar2 & 0x1f) |
                     ~(byte)(1 << (bVar2 & 0x1f)) & *destination;
      destination = destination + (iVar3 == 0);
      uVar1 = (ulong)((int)uVar1 - 1);
      read_pos = read_pos - 1;
      size = size + -1;
    } while (size != 0);
  }
  return;
}

Assistant:

void bit_copy(byte_t source, byte_t * destination, int read_pos, int write_pos, int size) {
    //TODO: need to improve, actually it's copying bit x bit...
    for(int offset=0; offset < size; offset++) {
        int source_idx = read_pos - offset;
        int dest_idx = write_pos - offset;
        if(dest_idx < 0) {
            // we have already moved to the next dest byte
            // add 8 bits to the dest_idx since it's negative now
            dest_idx += SYMBOL_BITS;
        }

        byte_t bit_val = (source >> source_idx) & SINGLE_BIT_1;  /* get bit_val from source. it will be ..00 or ..01 */
        *destination &= ~(SINGLE_BIT_1 << dest_idx);             /* set to 0 the destination bit */
        *destination |= (bit_val << dest_idx);                   /* set to bit_val the destination bit */

        if(dest_idx == 0) {
            // we have used all bits from destination, move to the next byte
            destination++;
        }
    }
}